

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O3

uint __thiscall PacketReader::GetNumber(PacketReader *this,size_t length)

{
  size_t sVar1;
  uint uVar2;
  unsigned_long __n2;
  ulong __n;
  array<unsigned_char,_4UL> bytes;
  undefined1 local_24 [4];
  
  sVar1 = this->pos;
  __n = (this->data)._M_string_length - sVar1;
  if (length <= __n) {
    __n = length;
  }
  if (0 < (long)__n) {
    memcpy(local_24,(this->data)._M_dataplus._M_p + sVar1,__n);
  }
  this->pos = sVar1 + length;
  uVar2 = PacketProcessor::Number(0xfe,0xfe,0xfe,0xfe);
  return uVar2;
}

Assistant:

unsigned int PacketReader::GetNumber(std::size_t length)
{
	std::array<unsigned char, 4> bytes{{254, 254, 254, 254}};

	std::copy_n(util::cbegin(this->data) + this->pos, std::min(length, this->Remaining()), util::begin(bytes));

	this->pos += length;

	return PacketProcessor::Number(bytes[0], bytes[1], bytes[2], bytes[3]);
}